

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

BoxList * __thiscall amrex::BoxList::parallelComplementIn(BoxList *this,Box *b,BoxArray *ba)

{
  uint uVar1;
  element_type *peVar2;
  pointer pBVar3;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> __last;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  __type_conflict1 _Var9;
  double dVar10;
  long lStack_a0;
  BoxList BStack_98;
  BoxList BStack_78;
  pointer apBStack_4c [3];
  
  peVar2 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar4 = ((long)*(pointer *)
                  ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) -
          *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data) / 0x1c;
  if (lVar4 == 1) {
    BoxArray::operator[]((Box *)&BStack_78,ba,0);
    boxDiff(&BStack_98,b,(Box *)&BStack_78);
    operator=(this,&BStack_98);
  }
  else {
    if (lVar4 == 0) {
      pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish != pBVar3) {
        (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = pBVar3;
      }
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,b);
      return this;
    }
    BoxArray::minimalBox((Box *)apBStack_4c,ba,&lStack_a0);
    boxDiff(&BStack_98,b,(Box *)apBStack_4c);
    operator=(this,&BStack_98);
    std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
              ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&BStack_98);
    uVar1 = (this->btype).itype;
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (int)stack0xffffffffffffffc8;
    BStack_78.btype.itype = SUB84(stack0xffffffffffffffc8,4);
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = apBStack_4c[0];
    Box::operator&=((Box *)&BStack_78,b);
    BoxList(&BStack_98,(Box *)&BStack_78);
    _Var9 = std::cbrt<long>(lStack_a0);
    dVar10 = ceil(_Var9 * 0.25);
    iVar7 = 1;
    if (1 < (int)dVar10 * 4) {
      iVar7 = (int)dVar10 * 4;
    }
    maxSize(&BStack_98,iVar7 << 2);
    uVar5 = ((long)BStack_98.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)BStack_98.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x1c;
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (Box *)0x0;
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = 0;
    uVar8 = 0;
    uVar6 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar6 = uVar8;
    }
    BStack_78.btype.itype = uVar1;
    for (; uVar6 * 0x1c - uVar8 != 0; uVar8 = uVar8 + 0x1c) {
      BoxArray::complementIn
                (ba,&BStack_78,
                 (Box *)((long)((BStack_98.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start)->smallend).vect + uVar8));
      __last._M_current._4_4_ =
           BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
      __last._M_current._0_4_ =
           BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish._0_4_;
      std::vector<amrex::Box,std::allocator<amrex::Box>>::
      insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)this,
                 (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                  )BStack_78.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start,__last);
    }
    std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
              ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&BStack_78);
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&BStack_98);
  return this;
}

Assistant:

BoxList&
BoxList::parallelComplementIn (const Box& b, BoxArray const& ba)
{
    BL_PROFILE("BoxList::parallelComplementIn()");
#ifndef AMREX_USE_MPI
    return complementIn(b,ba);
#else
    if (ba.size() <= 8)
    {
        return complementIn(b,ba);
    }
    else
    {
        BL_PROFILE_VAR("BoxList::pci", boxlistpci);

        Long npts_avgbox;
        Box mbox = ba.minimalBox(npts_avgbox);
        *this = amrex::boxDiff(b, mbox);
        auto mytyp = ixType();

        BoxList bl_mesh(mbox & b);

#if (AMREX_SPACEDIM == 1)
        Real s_avgbox = static_cast<Real>(npts_avgbox);
#elif (AMREX_SPACEDIM == 2)
        Real s_avgbox = static_cast<Real>(std::sqrt(npts_avgbox));
#elif (AMREX_SPACEDIM == 3)
        Real s_avgbox = static_cast<Real>(std::cbrt(npts_avgbox));
#endif

        const int block_size = 4 * std::max(1,static_cast<int>(std::ceil(s_avgbox/4.))*4);
        bl_mesh.maxSize(block_size);
        const int N = bl_mesh.size();

        const int nprocs = ParallelContext::NProcsSub();
        const int myproc = ParallelContext::MyProcSub();
        const int navg = N / nprocs;
        const int nextra = N - navg*nprocs;
        const int ilo = (myproc < nextra) ? myproc*(navg+1) : myproc*navg+nextra;
        const int ihi = (myproc < nextra) ? ilo+navg+1-1 : ilo+navg-1;

        Vector<Box> local_boxes;

#ifdef AMREX_USE_OMP
        bool start_omp_parallel = !omp_in_parallel();
        const int nthreads = omp_get_max_threads();
#else
        bool start_omp_parallel = false;
#endif

        if (start_omp_parallel)
        {
#ifdef AMREX_USE_OMP
            Vector<BoxList> bl_priv(nthreads, BoxList(mytyp));
            int ntot = 0;
#pragma omp parallel reduction(+:ntot)
            {
                BoxList bl_tmp(mytyp);
                auto& vbox = bl_priv[omp_get_thread_num()].m_lbox;
#pragma omp for
                for (int i = ilo; i <= ihi; ++i)
                {
                    ba.complementIn(bl_tmp, bl_mesh.m_lbox[i]);
                    vbox.insert(std::end(vbox), std::begin(bl_tmp), std::end(bl_tmp));
                }
                ntot += bl_tmp.size();
            }
            local_boxes.reserve(ntot);
            for (auto& bl : bl_priv) {
                local_boxes.insert(std::end(local_boxes), std::begin(bl), std::end(bl));
            }
#else
            amrex::Abort("BoxList::complementIn: how did this happen");
#endif
        }
        else
        {
            BoxList bl_tmp(mytyp);
            for (int i = ilo; i <= ihi; ++i)
            {
                ba.complementIn(bl_tmp, bl_mesh.m_lbox[i]);
                local_boxes.insert(std::end(local_boxes), std::begin(bl_tmp), std::end(bl_tmp));
            }
        }

        amrex::AllGatherBoxes(local_boxes, this->size());
        local_boxes.insert(std::end(local_boxes), std::begin(m_lbox), std::end(m_lbox));
        std::swap(m_lbox, local_boxes);

        return *this;
    }
#endif
}